

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obme.cpp
# Opt level: O3

char * obme::OBME_D(char *data,int length)

{
  byte bVar1;
  ulong uVar2;
  
  if (1 < length) {
    uVar2 = (ulong)(uint)length + 1;
    do {
      bVar1 = data[uVar2 - 2];
      if (_OBME_MASK == (byte *)0x0) {
        obme_init();
      }
      data[uVar2 - 2] = bVar1 ^ *_OBME_MASK;
      uVar2 = uVar2 - 1;
    } while (2 < uVar2);
  }
  return data;
}

Assistant:

char* OBME_D(char *data, int length)
	{
		while(length > 1) {
			--length;
			data[length] = OBME(data[length]);
		}
		return data;
	}